

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbits.cpp
# Opt level: O0

void testfiles(wins *wins_ar,int ar_len)

{
  Am_Drawonable *pAVar1;
  byte bVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  Am_Image_Array local_50 [4];
  int left;
  Am_Style local_48 [8];
  Am_Style image_style;
  Am_Image_Array local_30 [8];
  Am_Image_Array image_array;
  int local_24;
  int n;
  Am_Drawonable *d;
  int i;
  int ar_len_local;
  wins *wins_ar_local;
  
  d._0_4_ = 0;
  do {
    if (ar_len <= (int)d) {
      return;
    }
    pAVar1 = wins_ar[(int)d].d1;
    for (local_24 = 0; local_24 < 5; local_24 = local_24 + 1) {
      pcVar3 = (char *)Am_Merge_Pathname(testfiles::filenames[local_24]);
      Am_Image_Array::Am_Image_Array(local_30,pcVar3);
      bVar2 = Am_Image_Array::Valid();
      if ((bVar2 & 1) == 0) {
        uVar4 = Am_Error("bitmap not found");
        Am_Image_Array::~Am_Image_Array(local_30);
        _Unwind_Resume(uVar4);
      }
      pcVar3 = testfiles::colornames[local_24];
      Am_Image_Array::Am_Image_Array(local_50,local_30);
      uVar5 = 0;
      Am_Style::Am_Style(local_48,pcVar3,8,1,0,1,&Am_DEFAULT_DASH_LIST,2,2,0,local_50);
      Am_Image_Array::~Am_Image_Array(local_50);
      (**(code **)(*(long *)pAVar1 + 0x160))
                (pAVar1,&Am_White,local_48,local_24 * 0x32 + 10,10,0x28,CONCAT44(uVar5,0x28),0);
      Am_Style::~Am_Style(local_48);
      Am_Image_Array::~Am_Image_Array(local_30);
    }
    d._0_4_ = (int)d + 1;
  } while( true );
}

Assistant:

void
testfiles(wins *wins_ar, int ar_len)
{
  static const char *filenames[5] = {IMFN_GREY, IMFN_HI, IMFN_SMILE, IMFN_FUN,
                                     IMFN_DIAMOND};
  static const char *colornames[5] = {"purple", "green", "blue", "black",
                                      "red"};

  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *d = wins_ar[i].d1;
    for (int n = 0; n < 5; n++) {
      Am_Image_Array image_array(Am_Merge_Pathname(filenames[n]));
      if (!image_array.Valid())
        Am_Error("bitmap not found");
      Am_Style image_style(colornames[n], 8, Am_CAP_BUTT, Am_JOIN_MITER,
                           Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                           Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                           Am_FILL_POLY_EVEN_ODD, image_array);
      int left = 10 + 50 * n;
      d->Draw_Rectangle(Am_White, image_style, left, 10, 40, 40);
    }
  }
}